

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetSourceFilePropertyCommand.cxx
# Opt level: O2

bool cmGetSourceFilePropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  string *name;
  cmMakefile *this;
  cmMakefile *mf;
  bool bVar2;
  bool bVar3;
  PolicyStatus PVar4;
  cmSourceFile *this_00;
  cmValue cVar5;
  bool source_file_directory_option_enabled;
  long lVar6;
  int iVar7;
  ulong uVar8;
  string *prop;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  string_view value;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  string_view value_00;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if ((lVar6 >> 5 != 3) && (lVar6 >> 5 != 5)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file,"called with incorrect number of arguments",
               (allocator<char> *)&source_file_directories);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&file);
    return false;
  }
  source_file_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  source_file_target_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  source_file_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  source_file_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  source_file_target_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  source_file_target_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __x._M_str = pbVar1[2]._M_dataplus._M_p;
  __x._M_len = pbVar1[2]._M_string_length;
  __y._M_str = "DIRECTORY";
  __y._M_len = 9;
  bVar2 = std::operator==(__x,__y);
  source_file_directory_option_enabled = lVar6 == 0xa0 && bVar2;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (lVar6 == 0xa0 && bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&source_file_directories,pbVar1 + 3);
    iVar7 = 4;
    bVar2 = false;
  }
  else {
    __x_00._M_str = pbVar1[2]._M_dataplus._M_p;
    __x_00._M_len = pbVar1[2]._M_string_length;
    __y_00._M_str = "TARGET_DIRECTORY";
    __y_00._M_len = 0x10;
    bVar3 = std::operator==(__x_00,__y_00);
    iVar7 = 2;
    bVar2 = false;
    if ((lVar6 == 0xa0) && (bVar2 = false, bVar3)) {
      bVar2 = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&source_file_target_directories,
                  (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + 3);
      iVar7 = 4;
    }
  }
  source_file_directory_makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  source_file_directory_makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  source_file_directory_makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                    (status,source_file_directory_option_enabled,bVar2,&source_file_directories,
                     &source_file_target_directories,&source_file_directory_makefiles);
  if (bVar3) {
    name = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (ulong)(uint)(iVar7 << 5);
    this = *source_file_directory_makefiles.
            super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
            super__Vector_impl_data._M_start;
    __x_01._M_str = *(char **)((long)&(name->_M_dataplus)._M_p + uVar8);
    __x_01._M_len = *(size_t *)((long)&name->_M_string_length + uVar8);
    __y_01._M_str = "GENERATED";
    __y_01._M_len = 9;
    bVar3 = std::operator==(__x_01,__y_01);
    if (bVar3) {
      mf = status->Makefile;
      PVar4 = cmMakefile::GetPolicyStatus(this,CMP0163,false);
      if (WARN < PVar4) {
        file.field_2._8_8_ =
             std::
             _Function_handler<bool_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGetSourceFilePropertyCommand.cxx:73:22)>
             ::_M_invoke;
        file.field_2._M_allocated_capacity =
             (size_type)
             std::
             _Function_handler<bool_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGetSourceFilePropertyCommand.cxx:73:22)>
             ::_M_manager;
        file._M_dataplus._M_p = (pointer)name;
        file._M_string_length = (size_type)mf;
        bVar2 = GetPropertyCommand::GetSourceFilePropertyGENERATED
                          ((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1,mf,
                           (function<bool_(bool)> *)&file);
        std::_Function_base::~_Function_base((_Function_base *)&file);
        goto LAB_00359ba6;
      }
    }
    SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded
              (&file,status,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,
               (bool)(source_file_directory_option_enabled | bVar2));
    this_00 = cmMakefile::GetSource(this,&file,Ambiguous);
    prop = (string *)((long)&(name->_M_dataplus)._M_p + uVar8);
    if ((((this_00 == (cmSourceFile *)0x0) &&
         ((__x_02._M_str = (prop->_M_dataplus)._M_p, __x_02._M_len = prop->_M_string_length,
          __y_02._M_str = "LOCATION", __y_02._M_len = 8, bVar2 = std::operator==(__x_02,__y_02),
          !bVar2 || (this_00 = cmMakefile::CreateSource(this,&file,false,Ambiguous),
                    this_00 == (cmSourceFile *)0x0)))) || (prop->_M_string_length == 0)) ||
       (cVar5 = cmSourceFile::GetPropertyForUser(this_00,prop), cVar5.Value == (string *)0x0)) {
      value_00._M_str = "NOTFOUND";
      value_00._M_len = 8;
      cmMakefile::AddDefinition(status->Makefile,name,value_00);
    }
    else {
      value._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
      value._M_len = (cVar5.Value)->_M_string_length;
      cmMakefile::AddDefinition(status->Makefile,name,value);
    }
    std::__cxx11::string::~string((string *)&file);
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
LAB_00359ba6:
  std::_Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~_Vector_base
            (&source_file_directory_makefiles.
              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&source_file_target_directories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&source_file_directories);
  return bVar2;
}

Assistant:

bool cmGetSourceFilePropertyCommand(std::vector<std::string> const& args,
                                    cmExecutionStatus& status)
{
  std::vector<std::string>::size_type args_size = args.size();
  if (args_size != 3 && args_size != 5) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;

  int property_arg_index = 2;
  if (args[2] == "DIRECTORY"_s && args_size == 5) {
    property_arg_index = 4;
    source_file_directory_option_enabled = true;
    source_file_directories.push_back(args[3]);
  } else if (args[2] == "TARGET_DIRECTORY"_s && args_size == 5) {
    property_arg_index = 4;
    source_file_target_option_enabled = true;
    source_file_target_directories.push_back(args[3]);
  }

  std::vector<cmMakefile*> source_file_directory_makefiles;
  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  if (!file_scopes_handled) {
    return false;
  }

  std::string const& var = args[0];
  std::string const& propName = args[property_arg_index];
  bool source_file_paths_should_be_absolute =
    source_file_directory_option_enabled || source_file_target_option_enabled;
  cmMakefile& directory_makefile = *source_file_directory_makefiles[0];

  // Special handling for GENERATED property.
  // Note: Only, if CMP0163 is set to NEW!
  if (propName == "GENERATED"_s) {
    auto& mf = status.GetMakefile();
    auto cmp0163 = directory_makefile.GetPolicyStatus(cmPolicies::CMP0163);
    bool const cmp0163new =
      cmp0163 != cmPolicies::OLD && cmp0163 != cmPolicies::WARN;
    if (cmp0163new) {
      return GetPropertyCommand::GetSourceFilePropertyGENERATED(
        args[1], mf, [&var, &mf](bool isGenerated) -> bool {
          // Set the value on the original Makefile scope, not the scope of the
          // requested directory.
          mf.AddDefinition(var, (isGenerated) ? cmValue("1") : cmValue("0"));
          return true;
        });
    }
  }

  // Get the source file.
  std::string const file =
    SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded(
      status, args[1], source_file_paths_should_be_absolute);
  cmSourceFile* sf = directory_makefile.GetSource(file);

  // for the location we must create a source file first
  if (!sf && propName == "LOCATION"_s) {
    sf = directory_makefile.CreateSource(file);
  }

  if (sf) {
    cmValue prop = nullptr;
    if (!propName.empty()) {
      prop = sf->GetPropertyForUser(propName);
    }
    if (prop) {
      // Set the value on the original Makefile scope, not the scope of the
      // requested directory.
      status.GetMakefile().AddDefinition(var, *prop);
      return true;
    }
  }

  // Set the value on the original Makefile scope, not the scope of the
  // requested directory.
  status.GetMakefile().AddDefinition(var, "NOTFOUND");
  return true;
}